

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturehelper.cpp
# Opt level: O0

void __thiscall
QOpenGLTextureHelper::qt_TextureImage2D
          (QOpenGLTextureHelper *this,GLuint texture,GLenum target,GLenum bindingTarget,GLint level,
          GLenum internalFormat,GLsizei width,GLsizei height,GLint border,GLenum format,GLenum type,
          GLvoid *pixels)

{
  undefined8 in_RDI;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  TextureBinder binder;
  GLenum in_stack_ffffffffffffff8c;
  GLenum in_stack_ffffffffffffff90;
  GLuint in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  TextureBinder *in_stack_ffffffffffffffa0;
  undefined1 *puVar1;
  undefined4 in_stack_ffffffffffffffb8;
  undefined8 uVar2;
  GLenum format_00;
  GLenum type_00;
  GLvoid *pixels_00;
  
  pixels_00 = *(GLvoid **)(in_FS_OFFSET + 0x28);
  format_00 = 0xaaaaaaaa;
  type_00 = 0xaaaaaaaa;
  puVar1 = &stack0xffffffffffffffd8;
  uVar2 = in_RDI;
  anon_unknown.dwarf_18e721::TextureBinder::TextureBinder
            (in_stack_ffffffffffffffa0,
             (QOpenGLFunctions *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  QOpenGLFunctions::glTexImage2D
            ((QOpenGLFunctions *)CONCAT44(in_R9D,in_stack_ffffffffffffffb8),
             (GLenum)((ulong)puVar1 >> 0x20),(GLint)puVar1,(GLint)((ulong)in_RDI >> 0x20),
             (GLsizei)in_RDI,internalFormat,(GLint)uVar2,format_00,type_00,pixels_00);
  anon_unknown.dwarf_18e721::TextureBinder::~TextureBinder((TextureBinder *)0x1a7d67);
  if (*(GLvoid **)(in_FS_OFFSET + 0x28) == pixels_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureHelper::qt_TextureImage2D(GLuint texture, GLenum target, GLenum bindingTarget, GLint level, GLenum internalFormat, GLsizei width, GLsizei height, GLint border, GLenum format, GLenum type, const GLvoid *pixels)
{
    TextureBinder binder(functions, texture, target, bindingTarget);
    functions->glTexImage2D(target, level, internalFormat, width, height, border, format, type, pixels);
}